

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

Expression * __thiscall slang::ast::CoverageOptionSetter::getExpression(CoverageOptionSetter *this)

{
  CoverageOptionSyntax *pCVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Expression *pEVar4;
  ASTContext local_78;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_40;
  
  if (this->expr != (Expression *)0x0) {
    return this->expr;
  }
  bVar2 = isTypeOption(this);
  local_78.scope.ptr = (this->scope).ptr;
  local_78.lookupIndex = 3;
  local_78.assertionInstance = (AssertionInstanceDetails *)0x0;
  local_78.flags.m_bits = 0;
  local_78.instanceOrProc = (Symbol *)0x0;
  local_78.firstTempVar = (TempVarSymbol *)0x0;
  local_78.randomizeDetails = (RandomizeDetails *)0x0;
  iVar3 = Expression::bind((int)(((this->syntax).ptr)->expr).ptr,(sockaddr *)&local_78,
                           (uint)bVar2 << 6 | 8);
  this->expr = (Expression *)CONCAT44(extraout_var,iVar3);
  pCVar1 = (this->syntax).ptr;
  syntax._M_ptr =
       (pCVar1->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax._M_extent._M_extent_value =
       (pCVar1->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  ASTContext::setAttributes(&local_78,(Expression *)CONCAT44(extraout_var,iVar3),syntax);
  pEVar4 = this->expr;
  if ((bVar2) && (pEVar4->kind == Assignment)) {
    ASTContext::eval((ConstantValue *)&local_40,&local_78,(Expression *)pEVar4[1].syntax,
                     (bitmask<slang::ast::EvalFlags>)0x0);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&local_40);
    pEVar4 = this->expr;
  }
  return pEVar4;
}

Assistant:

const Expression& CoverageOptionSetter::getExpression() const {
    if (!expr) {
        bitmask<ASTFlags> flags = ASTFlags::AssignmentAllowed;
        bool isTypeOpt = isTypeOption();
        if (isTypeOpt)
            flags |= ASTFlags::StaticInitializer;

        ASTContext context(*scope, LookupLocation(scope, 3));
        expr = &Expression::bind(*syntax->expr, context, flags);
        context.setAttributes(*expr, syntax->attributes);

        if (isTypeOpt && expr->kind == ExpressionKind::Assignment)
            context.eval(expr->as<AssignmentExpression>().right());
    }
    return *expr;
}